

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O0

key_e __thiscall libchars::editor::decode_key(editor *this,uint8_t c)

{
  byte bVar1;
  size_t sVar2;
  char *__s;
  int iVar3;
  size_t sVar4;
  debug *this_00;
  double __x;
  char local_148 [7];
  uint8_t cc;
  char buffer [256];
  ulong local_40;
  size_t i;
  size_t T_seq_N;
  char *T_seq;
  size_t idx;
  uint8_t c_local;
  editor *this_local;
  
  if (this->seq_N < 0x10) {
    sVar2 = this->seq_N;
    this->seq_N = sVar2 + 1;
    this->seq[sVar2] = c;
    for (T_seq = (char *)0x0; T_seq < (char *)0x19; T_seq = T_seq + 1) {
      __s = *(char **)(__decode_table + (long)T_seq * 0x10);
      sVar4 = strlen(__s);
      iVar3 = memcmp(__s,this->seq,this->seq_N);
      if (iVar3 == 0) {
        if (sVar4 == this->seq_N) {
          this->seq_N = 0;
          if ((this->obj->mode == MODE_MULTILINE) &&
             (*(int *)(__decode_table + (long)T_seq * 0x10 + 8) == 10)) {
            return KEY_EOF;
          }
          return *(key_e *)(__decode_table + (long)T_seq * 0x10 + 8);
        }
        if (this->seq_N < sVar4) {
          return PARTIAL_SEQ;
        }
      }
    }
  }
  if ((1 < this->seq_N) || (iVar3 = isprint((uint)c), iVar3 == 0)) {
    memset(local_148,0,0x100);
    for (local_40 = 0; local_40 < this->seq_N; local_40 = local_40 + 1) {
      bVar1 = this->seq[local_40];
      iVar3 = isprint((uint)bVar1);
      if (iVar3 == 0) {
        sVar4 = strlen(local_148);
        sprintf(local_148 + sVar4,"\\x%02x",(ulong)bVar1);
      }
      else {
        sVar4 = strlen(local_148);
        sprintf(local_148 + sVar4,"%c",(ulong)bVar1);
      }
    }
    this_00 = debug::initialize(0);
    debug::log(this_00,__x);
  }
  this->seq_N = 0;
  if ((this->obj->mode == MODE_COMMAND) && (c == '?')) {
    this_local._4_4_ = KEY_HELP;
  }
  else {
    iVar3 = isprint((uint)c);
    if (iVar3 == 0) {
      this_local._4_4_ = IGNORE_SEQ;
    }
    else {
      this_local._4_4_ = PRINTABLE_CHAR;
    }
  }
  return this_local._4_4_;
}

Assistant:

key_e editor::decode_key(uint8_t c)
    {
        if (seq_N < MAX_DECODE_SEQUENCE) {
            seq[seq_N++] = c;
            size_t idx;
            for (idx = 0; idx < DECODE_TABLE_ENTRIES; ++idx) {
                const char *T_seq = __decode_table[idx].sequence;
                size_t T_seq_N = strlen(T_seq);
                if (memcmp(T_seq, seq, seq_N) == 0) {
                    if (T_seq_N == seq_N) {
                        seq_N = 0;
                        if (obj->mode == MODE_MULTILINE && __decode_table[idx].result == KEY_DEL)
                            return KEY_EOF;
                        else
                            return __decode_table[idx].result;
                    }
                    else if (T_seq_N > seq_N) {
                        return PARTIAL_SEQ;
                    }
                }
            }
        }

        if (seq_N>1 || !isprint(c)) {
            size_t i;
            char buffer[256] = "";
            for (i=0; i<seq_N; ++i) {
                uint8_t cc = seq[i];
                if (isprint(cc))
                    sprintf(buffer+strlen(buffer), "%c", cc);
                else
                    sprintf(buffer+strlen(buffer), "\\x%02x", cc);
            }
            LC_LOG_DEBUG("UNKNOWN SEQUENCE: --> %s <--",buffer);
        }

        seq_N = 0;

        if (obj->mode == MODE_COMMAND && c == '?')
            return KEY_HELP;
        else if (isprint(c))
            return PRINTABLE_CHAR;
        else
            return IGNORE_SEQ;
    }